

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_softlocks.hpp
# Opt level: O0

void PatchFixSoftlocks::fix_fara_arena_chest_softlock(ROM *rom,World *world)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  uint32_t uVar1;
  Map *this;
  Code *pCVar2;
  Code local_4a8;
  allocator<char> local_421;
  string local_420;
  uint32_t local_400;
  allocator<md::AddressRegister> local_3f9;
  uint32_t addr;
  AddressRegister local_3e8;
  AddressRegister local_3d8;
  AddressRegister local_3c8;
  AddressRegister local_3b8;
  AddressRegister local_3a8;
  AddressRegister local_398;
  iterator local_388;
  size_type local_380;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_378;
  allocator<md::DataRegister> local_359;
  DataRegister local_358;
  DataRegister local_348;
  DataRegister local_338;
  DataRegister local_328;
  DataRegister local_318;
  DataRegister local_308;
  DataRegister local_2f8;
  DataRegister local_2e8;
  iterator local_2d8;
  size_type local_2d0;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_2c8;
  allocator<char> local_2a9;
  string local_2a8;
  DataRegister local_288;
  AddressRegister local_278;
  AddressRegister local_268;
  AddressInRegister local_258;
  allocator<char> local_231;
  string local_230;
  DataRegister local_210;
  AddressRegister local_200;
  allocator<md::AddressRegister> local_1e9;
  AddressRegister local_1e8;
  AddressRegister local_1d8;
  AddressRegister local_1c8;
  AddressRegister local_1b8;
  AddressRegister local_1a8;
  AddressRegister local_198;
  AddressRegister local_188;
  iterator local_178;
  size_type local_170;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_168;
  allocator<md::DataRegister> local_14d [13];
  DataRegister local_140;
  DataRegister local_130;
  DataRegister local_120;
  DataRegister local_110;
  DataRegister local_100;
  DataRegister local_f0;
  DataRegister local_e0;
  DataRegister local_d0;
  iterator local_c0;
  size_type local_b8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_b0;
  undefined1 local_98 [8];
  Code func;
  Entity *chest;
  World *world_local;
  ROM *rom_local;
  
  this = World::map(world,0x1c);
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)Map::entity(this,'\x0e');
  Entity::position((Entity *)func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count,'\x1a',
                   '\x13','\x04');
  Entity::behavior_id((Entity *)func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
  md::Code::Code((Code *)local_98);
  md::DataRegister::DataRegister(&local_140,'\0');
  md::DataRegister::DataRegister(&local_130,'\x01');
  md::DataRegister::DataRegister(&local_120,'\x02');
  md::DataRegister::DataRegister(&local_110,'\x03');
  md::DataRegister::DataRegister(&local_100,'\x04');
  md::DataRegister::DataRegister(&local_f0,'\x05');
  md::DataRegister::DataRegister(&local_e0,'\x06');
  md::DataRegister::DataRegister(&local_d0,'\a');
  local_c0 = &local_140;
  local_b8 = 8;
  std::allocator<md::DataRegister>::allocator(local_14d);
  __l_02._M_len = local_b8;
  __l_02._M_array = local_c0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_b0,__l_02,local_14d);
  md::AddressRegister::AddressRegister(&local_1e8,'\0');
  md::AddressRegister::AddressRegister(&local_1d8,'\x01');
  md::AddressRegister::AddressRegister(&local_1c8,'\x02');
  md::AddressRegister::AddressRegister(&local_1b8,'\x03');
  md::AddressRegister::AddressRegister(&local_1a8,'\x04');
  md::AddressRegister::AddressRegister(&local_198,'\x05');
  md::AddressRegister::AddressRegister(&local_188,'\x06');
  local_178 = &local_1e8;
  local_170 = 7;
  std::allocator<md::AddressRegister>::allocator(&local_1e9);
  __l_01._M_len = local_170;
  __l_01._M_array = local_178;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_168,__l_01,&local_1e9);
  md::Code::movem_to_stack((Code *)local_98,&local_b0,&local_168);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_168);
  std::allocator<md::AddressRegister>::~allocator(&local_1e9);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_b0);
  std::allocator<md::DataRegister>::~allocator(local_14d);
  md::AddressRegister::AddressRegister(&local_200,'\0');
  md::Code::lea((Code *)local_98,0xff5480,&local_200);
  md::DataRegister::DataRegister(&local_210,'\0');
  md::Code::moveq((Code *)local_98,'\r',&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"loop_remove_entities",&local_231);
  md::Code::label((Code *)local_98,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  md::AddressRegister::AddressRegister(&local_268,'\0');
  addr_<void>(&local_258,&local_268);
  md::Code::movew((Code *)local_98,0x7f7f,&local_258.super_Param);
  md::AddressRegister::AddressRegister(&local_278,'\0');
  md::Code::adda((Code *)local_98,0x80,&local_278);
  md::DataRegister::DataRegister(&local_288,'\0');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"loop_remove_entities",&local_2a9);
  md::Code::dbra((Code *)local_98,&local_288,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  md::DataRegister::DataRegister(&local_358,'\0');
  md::DataRegister::DataRegister(&local_348,'\x01');
  md::DataRegister::DataRegister(&local_338,'\x02');
  md::DataRegister::DataRegister(&local_328,'\x03');
  md::DataRegister::DataRegister(&local_318,'\x04');
  md::DataRegister::DataRegister(&local_308,'\x05');
  md::DataRegister::DataRegister(&local_2f8,'\x06');
  md::DataRegister::DataRegister(&local_2e8,'\a');
  local_2d8 = &local_358;
  local_2d0 = 8;
  std::allocator<md::DataRegister>::allocator(&local_359);
  __l_00._M_len = local_2d0;
  __l_00._M_array = local_2d8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_2c8,__l_00,&local_359);
  md::AddressRegister::AddressRegister((AddressRegister *)&addr,'\0');
  md::AddressRegister::AddressRegister(&local_3e8,'\x01');
  md::AddressRegister::AddressRegister(&local_3d8,'\x02');
  md::AddressRegister::AddressRegister(&local_3c8,'\x03');
  md::AddressRegister::AddressRegister(&local_3b8,'\x04');
  md::AddressRegister::AddressRegister(&local_3a8,'\x05');
  md::AddressRegister::AddressRegister(&local_398,'\x06');
  local_388 = (iterator)&addr;
  local_380 = 7;
  std::allocator<md::AddressRegister>::allocator(&local_3f9);
  __l._M_len = local_380;
  __l._M_array = local_388;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_378,__l,&local_3f9);
  md::Code::movem_from_stack((Code *)local_98,&local_2c8,&local_378);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_378);
  std::allocator<md::AddressRegister>::~allocator(&local_3f9);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_2c8);
  std::allocator<md::DataRegister>::~allocator(&local_359);
  md::Code::rts((Code *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"",&local_421);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_98,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  local_4a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_4a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_4a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_4a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a8._labels._M_t._M_impl._0_8_ = 0;
  local_4a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_4a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_4a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_4a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_4a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8._pending_branches._M_t._M_impl._0_8_ = 0;
  local_4a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_400 = uVar1;
  md::Code::Code(&local_4a8);
  pCVar2 = md::Code::jsr(&local_4a8,local_400);
  pCVar2 = md::Code::nop(pCVar2,1);
  md::ROM::set_code(rom,0x19be0,pCVar2);
  md::Code::~Code(&local_4a8);
  md::Code::~Code((Code *)local_98);
  return;
}

Assistant:

static void fix_fara_arena_chest_softlock(md::ROM& rom, const World& world)
    {
        // Move the chest to the ground
        Entity* chest = world.map(MAP_SWAMP_SHRINE_BOSS_ROOM)->entity(14);
        chest->position(26, 19, 4);
        chest->behavior_id(0);

        // Function to remove all entities but the chest when coming back in the room
        md::Code func;
        func.movem_to_stack({ reg_D0_D7 }, { reg_A0_A6 });
        {
            func.lea(0xFF5480, reg_A0);
            func.moveq(0xD, reg_D0);
            func.label("loop_remove_entities");
            {
                func.movew(0x7F7F, addr_(reg_A0));
                func.adda(0x80, reg_A0);
            }
            func.dbra(reg_D0, "loop_remove_entities");
        }
        func.movem_from_stack({ reg_D0_D7 }, { reg_A0_A6 });
        func.rts();

        uint32_t addr = rom.inject_code(func);

        // Call the injected function
        rom.set_code(0x019BE0, md::Code().jsr(addr).nop());
    }